

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

void __thiscall
llvm::cl::
opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::printOptionValue(opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,size_t GlobalWidth,bool Force)

{
  bool bVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,Force) == 0) {
    bVar1 = OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::compare(&(this->
                       super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                       ).Default.
                       super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,&(this->
                        super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                        ).super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>);
    if (!bVar1) {
      return;
    }
  }
  printOptionDiff<llvm::cl::parser<std::__cxx11::string>,std::__cxx11::string>
            (&this->super_Option,
             &(this->Parser).
              super_basic_parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(this->
               super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
               ).super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,
             &(this->
              super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
              ).Default,GlobalWidth);
  return;
}

Assistant:

void printOptionValue(size_t GlobalWidth, bool Force) const override {
    if (Force || this->getDefault().compare(this->getValue())) {
      cl::printOptionDiff<ParserClass>(*this, Parser, this->getValue(),
                                       this->getDefault(), GlobalWidth);
    }
  }